

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void __thiscall cs::function::add_reserve_var(function *this,string *reserve,bool is_mem_fn)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_t __n;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  int iVar7;
  long *plVar8;
  runtime_error *this_01;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string prefix;
  string suffix;
  undefined1 local_118 [24];
  long lStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  ulong local_60;
  long lStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  this->mIsMemFn = is_mem_fn;
  if (this->mIsVargs == false) {
    paVar1 = &local_f0.field_2;
    pcVar2 = (reserve->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + reserve->_M_string_length);
    __l._M_len = 1;
    __l._M_array = &local_f0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118,__l,(allocator_type *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118,
              (long)(this->mArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
    pbVar3 = (this->mArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar12 = (this->mArgs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
        pbVar12 = pbVar12 + 1) {
      __n = pbVar12->_M_string_length;
      if ((__n == reserve->_M_string_length) &&
         ((__n == 0 ||
          (iVar7 = bcmp((pbVar12->_M_dataplus)._M_p,(reserve->_M_dataplus)._M_p,__n), iVar7 == 0))))
      {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"Overwrite the default argument \"","");
        std::operator+(&local_b0,&local_d0,reserve);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_f0._M_dataplus._M_p = (pointer)*plVar8;
        psVar10 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_f0._M_dataplus._M_p == psVar10) {
          local_f0.field_2._M_allocated_capacity = *psVar10;
          local_f0.field_2._8_8_ = plVar8[3];
          local_f0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar10;
        }
        local_f0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        runtime_error::runtime_error(this_01,&local_f0);
        __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_118,
                 pbVar12);
    }
    pbVar4 = (this->mArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->mArgs).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_118._16_8_;
    pbVar5 = (this->mArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (this->mArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->mArgs).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_118._0_8_;
    (this->mArgs).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_118._8_8_;
    local_118._0_8_ = pbVar5;
    local_118._8_8_ = pbVar6;
    local_118._16_8_ = pbVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_allocated_capacity =
       local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  this_00 = &this->mDecl;
  std::__cxx11::string::find((char)this_00,0x28);
  std::__cxx11::string::rfind((char)this_00,0x29);
  std::__cxx11::string::substr((ulong)&local_d0,(ulong)this_00);
  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::substr((ulong)&local_d0,(ulong)this_00);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  if (((ulong)((long)(this->mArgs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) < 0x21) && (this->mIsVargs != true))
  {
    local_118._0_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_118 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    std::__cxx11::string::append(local_118);
    plVar8 = (long *)std::__cxx11::string::_M_append(local_118,(ulong)local_b0._M_dataplus._M_p);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_d0.field_2._M_allocated_capacity = *psVar10;
      local_d0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar10;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_80._M_dataplus._M_p = (pointer)local_118._16_8_;
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._0_8_;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_118 + 0x10))
    goto LAB_0019da01;
  }
  else {
    local_90[0] = &local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    std::__cxx11::string::append((char *)local_90);
    plVar8 = (long *)std::__cxx11::string::append((char *)local_90);
    puVar9 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar9) {
      local_60 = *puVar9;
      lStack_58 = plVar8[3];
      local_80.field_2._M_allocated_capacity = (size_type)&local_60;
    }
    else {
      local_60 = *puVar9;
      local_80.field_2._M_allocated_capacity = (size_type)(ulong *)*plVar8;
    }
    local_80.field_2._8_8_ = plVar8[1];
    *plVar8 = (long)puVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
    uVar11 = 0xf;
    if ((ulong *)local_80.field_2._M_allocated_capacity != &local_60) {
      uVar11 = local_60;
    }
    if (uVar11 < (ulong)(local_48 + local_80.field_2._8_8_)) {
      uVar11 = 0xf;
      if (local_50 != local_40) {
        uVar11 = local_40[0];
      }
      if (uVar11 < (ulong)(local_48 + local_80.field_2._8_8_)) goto LAB_0019d7cd;
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_50,0,(char *)0x0,
                                  local_80.field_2._M_allocated_capacity);
    }
    else {
LAB_0019d7cd:
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 (local_80.field_2._M_local_buf,(ulong)local_50);
    }
    local_118._0_8_ = local_118 + 0x10;
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar8 + 2);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8 == pbVar12) {
      local_118._16_8_ = (pbVar12->_M_dataplus)._M_p;
      lStack_100 = plVar8[3];
    }
    else {
      local_118._16_8_ = (pbVar12->_M_dataplus)._M_p;
      local_118._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8
      ;
    }
    local_118._8_8_ = plVar8[1];
    *plVar8 = (long)pbVar12;
    plVar8[1] = 0;
    *(undefined1 *)&(pbVar12->_M_dataplus)._M_p = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append(local_118,(ulong)local_b0._M_dataplus._M_p);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_d0.field_2._M_allocated_capacity = *psVar10;
      local_d0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar10;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_118._16_8_)->_M_p + 1));
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if ((ulong *)local_80.field_2._M_allocated_capacity != &local_60) {
      operator_delete((void *)local_80.field_2._M_allocated_capacity,local_60 + 1);
    }
    pbVar12 = local_90[0];
    if (local_90[0] == &local_80) goto LAB_0019da01;
  }
  operator_delete(pbVar12,(ulong)((long)&(((pointer)local_80._M_dataplus._M_p)->_M_dataplus)._M_p +
                                 1));
LAB_0019da01:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add_reserve_var(const std::string &reserve, bool is_mem_fn = false)
		{
			mIsMemFn = is_mem_fn;
			if (!mIsVargs) {
				std::vector<std::string> args{reserve};
				args.reserve(mArgs.size());
				for (auto &name: mArgs) {
					if (name != reserve)
						args.emplace_back(std::move(name));
					else
						throw runtime_error(std::string("Overwrite the default argument \"") + reserve + "\".");
				}
				std::swap(mArgs, args);
			}
#ifdef CS_DEBUGGER
			std::string prefix, suffix;
			auto lpos = mDecl.find('(') + 1;
			auto rpos = mDecl.rfind(')');
			prefix = mDecl.substr(0, lpos);
			suffix = mDecl.substr(rpos);
			if(mArgs.size() > 1 || mIsVargs)
				mDecl = prefix + "this" + (mIsVargs ? ", ..." : ", ") + mDecl.substr(lpos, rpos-lpos) + suffix;
			else
				mDecl = prefix + "this" + suffix;
#endif
		}